

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.hpp
# Opt level: O0

void __thiscall inja::Renderer::visit(Renderer *this,ExtendsStatementNode *node)

{
  bool bVar1;
  pointer ppVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  Template *local_30;
  Template *parent_template;
  _Self local_20;
  const_iterator included_template_it;
  ExtendsStatementNode *node_local;
  Renderer *this_local;
  
  included_template_it._M_node = (_Base_ptr)node;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>_>_>
       ::find(this->template_storage,&node->file);
  parent_template =
       (Template *)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>_>_>
       ::end(this->template_storage);
  bVar1 = std::operator!=(&local_20,(_Self *)&parent_template);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>_>
             ::operator->(&local_20);
    local_30 = &ppVar2->second;
    render_to(this,this->output_stream,local_30,this->data_input,&this->additional_data);
    this->break_rendering = true;
  }
  else if (((this->config).throw_at_missing_includes & 1U) != 0) {
    ::std::operator+(&local_70,"extends \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &(included_template_it._M_node)->_M_left);
    ::std::operator+(&local_50,&local_70,"\' not found");
    throw_renderer_error(this,&local_50,(AstNode *)included_template_it._M_node);
    ::std::__cxx11::string::~string((string *)&local_50);
    ::std::__cxx11::string::~string((string *)&local_70);
  }
  return;
}

Assistant:

void visit(const ExtendsStatementNode& node) {
    const auto included_template_it = template_storage.find(node.file);
    if (included_template_it != template_storage.end()) {
      const Template* parent_template = &included_template_it->second;
      render_to(*output_stream, *parent_template, *data_input, &additional_data);
      break_rendering = true;
    } else if (config.throw_at_missing_includes) {
      throw_renderer_error("extends '" + node.file + "' not found", node);
    }
  }